

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O3

char * Mio_LibDeriveSop(int nVars,Vec_Int_t *vExpr,Vec_Str_t *vStr)

{
  uint *puVar1;
  char cVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  size_t sVar5;
  char *pcVar6;
  uint *__ptr;
  void *pvVar7;
  uint *puVar8;
  Vec_Int_t *pVVar9;
  uint *puVar10;
  uint *puVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int i;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  uint *puVar24;
  int iVar25;
  char **ppcVar26;
  ulong local_c0;
  
  vStr->nSize = 0;
  uVar15 = vExpr->nSize;
  if ((int)uVar15 < 1) {
LAB_008b9c3c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (*vExpr->pArray == -2) {
    ppcVar26 = &vStr->pArray;
    lVar19 = 0;
    do {
      cVar2 = ".names n%0*d\n 1\n"[lVar19 + 0xd];
      uVar15 = vStr->nSize;
      if (uVar15 == vStr->nCap) {
        if ((int)uVar15 < 0x10) {
          if (*ppcVar26 == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(*ppcVar26,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar5 = (ulong)uVar15 * 2;
          if (*ppcVar26 == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar5);
          }
          else {
            pcVar6 = (char *)realloc(*ppcVar26,sVar5);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar5;
        }
      }
      else {
        pcVar6 = *ppcVar26;
      }
      iVar17 = vStr->nSize;
      vStr->nSize = iVar17 + 1;
      pcVar6[iVar17] = cVar2;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
  }
  else {
    if (*vExpr->pArray != -1) {
      if (uVar15 == 1) {
        iVar17 = nVars;
        if (0 < nVars) {
          do {
            uVar15 = vStr->nSize;
            if (uVar15 == vStr->nCap) {
              if ((int)uVar15 < 0x10) {
                if (vStr->pArray == (char *)0x0) {
                  pcVar6 = (char *)malloc(0x10);
                }
                else {
                  pcVar6 = (char *)realloc(vStr->pArray,0x10);
                }
                vStr->pArray = pcVar6;
                vStr->nCap = 0x10;
              }
              else {
                sVar5 = (ulong)uVar15 * 2;
                if (vStr->pArray == (char *)0x0) {
                  pcVar6 = (char *)malloc(sVar5);
                }
                else {
                  pcVar6 = (char *)realloc(vStr->pArray,sVar5);
                }
                vStr->pArray = pcVar6;
                vStr->nCap = (int)sVar5;
              }
            }
            else {
              pcVar6 = vStr->pArray;
            }
            iVar14 = vStr->nSize;
            vStr->nSize = iVar14 + 1;
            pcVar6[iVar14] = '-';
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
        }
        ppcVar26 = &vStr->pArray;
        lVar19 = 0;
        do {
          cVar2 = ".names n%0*d\n 1\n"[lVar19 + 0xd];
          uVar15 = vStr->nSize;
          if (uVar15 == vStr->nCap) {
            if ((int)uVar15 < 0x10) {
              if (*ppcVar26 == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(*ppcVar26,0x10);
              }
              vStr->pArray = pcVar6;
              vStr->nCap = 0x10;
            }
            else {
              sVar5 = (ulong)uVar15 * 2;
              if (*ppcVar26 == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar5);
              }
              else {
                pcVar6 = (char *)realloc(*ppcVar26,sVar5);
              }
              vStr->pArray = pcVar6;
              vStr->nCap = (int)sVar5;
            }
          }
          else {
            pcVar6 = *ppcVar26;
          }
          iVar17 = vStr->nSize;
          vStr->nSize = iVar17 + 1;
          pcVar6[iVar17] = cVar2;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        uVar15 = vStr->nSize;
        if (uVar15 == vStr->nCap) {
          if ((int)uVar15 < 0x10) {
            if (*ppcVar26 == (char *)0x0) {
              pcVar6 = (char *)malloc(0x10);
            }
            else {
              pcVar6 = (char *)realloc(*ppcVar26,0x10);
            }
            vStr->pArray = pcVar6;
            vStr->nCap = 0x10;
          }
          else {
            sVar5 = (ulong)uVar15 * 2;
            if (*ppcVar26 == (char *)0x0) {
              pcVar6 = (char *)malloc(sVar5);
            }
            else {
              pcVar6 = (char *)realloc(*ppcVar26,sVar5);
            }
            vStr->pArray = pcVar6;
            vStr->nCap = (int)sVar5;
          }
        }
        else {
          pcVar6 = *ppcVar26;
        }
        iVar17 = vStr->nSize;
        vStr->nSize = iVar17 + 1;
        pcVar6[iVar17] = '\0';
        if (vExpr->nSize < 1) goto LAB_008b9c3c;
        uVar15 = *vExpr->pArray >> 1;
        if (nVars <= (int)uVar15) {
          __assert_fail("(Vec_IntEntry(vExpr,0) >> 1) < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioSop.c"
                        ,0x119,"char *Mio_LibDeriveSop(int, Vec_Int_t *, Vec_Str_t *)");
        }
        if (((int)uVar15 < 0) || (vStr->nSize <= (int)uVar15)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        (*ppcVar26)[uVar15] = (byte)*vExpr->pArray & 1 ^ 0x31;
        goto LAB_008b9552;
      }
      __ptr = (uint *)malloc(0x10);
      uVar16 = 8;
      if (6 < ((uVar15 >> 1) + nVars) - 1) {
        uVar16 = (ulong)((uVar15 >> 1) + nVars);
      }
      __ptr[1] = 0;
      uVar12 = (uint)uVar16;
      *__ptr = uVar12;
      if (uVar12 == 0) {
        pvVar7 = (void *)0x0;
      }
      else {
        pvVar7 = malloc((long)(int)uVar12 * 8);
      }
      *(void **)(__ptr + 2) = pvVar7;
      puVar8 = (uint *)malloc(0x10);
      uVar20 = 0;
      puVar8[1] = 0;
      *puVar8 = uVar12;
      if (uVar12 == 0) {
        pvVar7 = (void *)0x0;
      }
      else {
        pvVar7 = malloc((long)(int)uVar12 << 3);
      }
      puVar24 = __ptr + 2;
      puVar1 = puVar8 + 2;
      *(void **)(puVar8 + 2) = pvVar7;
      local_c0 = uVar16;
      if (nVars < 1) {
        uVar12 = 0;
LAB_008b9756:
        lVar19 = 0;
        lVar22 = 0;
        do {
          if (((int)uVar15 <= lVar19) || ((ulong)uVar15 <= lVar19 + 1U)) goto LAB_008b9c3c;
          iVar17 = (int)lVar22;
          iVar25 = (int)uVar20 + iVar17;
          iVar13 = uVar12 + iVar17;
          uVar15 = vExpr->pArray[lVar22 * 2];
          uVar18 = (int)uVar15 >> 1;
          uVar3 = vExpr->pArray[lVar22 * 2 + 1];
          puVar10 = puVar24;
          iVar14 = iVar13;
          if ((uVar15 & 1) == 0) {
            puVar10 = puVar1;
            iVar14 = iVar25;
          }
          if (((int)uVar18 < 0) || (iVar14 <= (int)uVar18)) {
LAB_008b9c1d:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar23 = (int)uVar3 >> 1;
          puVar11 = puVar24;
          iVar14 = iVar13;
          if ((uVar3 & 1) == 0) {
            puVar11 = puVar1;
            iVar14 = iVar25;
          }
          if (((int)uVar23 < 0) || (iVar14 <= (int)uVar23)) goto LAB_008b9c1d;
          pVVar9 = Mio_SopCoverAnd(*(Vec_Int_t **)(*(long *)puVar10 + (ulong)uVar18 * 8),
                                   *(Vec_Int_t **)(*(long *)puVar11 + (ulong)uVar23 * 8));
          iVar14 = (int)local_c0;
          if (iVar25 == iVar14) {
            if (iVar14 < 0x10) {
              if (*(void **)puVar1 == (void *)0x0) {
                pvVar7 = malloc(0x80);
              }
              else {
                pvVar7 = realloc(*(void **)puVar1,0x80);
              }
              *(void **)(puVar8 + 2) = pvVar7;
              *puVar8 = 0x10;
              local_c0 = 0x10;
            }
            else {
              local_c0 = (ulong)(uint)(iVar14 * 2);
              if (*(void **)puVar1 == (void *)0x0) {
                pvVar7 = malloc(local_c0 * 8);
              }
              else {
                pvVar7 = realloc(*(void **)puVar1,local_c0 * 8);
              }
              *(void **)(puVar8 + 2) = pvVar7;
              *puVar8 = iVar14 * 2;
            }
          }
          else {
            pvVar7 = *(void **)puVar1;
          }
          puVar8[1] = (int)uVar20 + iVar17 + 1;
          *(Vec_Int_t **)((long)pvVar7 + lVar22 * 8 + (uVar20 & 0xffffffff) * 8) = pVVar9;
          if ((uVar15 & 1) == 0) {
            puVar10 = puVar24;
            if (iVar13 <= (int)uVar18) goto LAB_008b9c1d;
          }
          else {
            puVar10 = puVar1;
            if (iVar25 < (int)uVar18) goto LAB_008b9c1d;
          }
          if ((uVar3 & 1) == 0) {
            puVar11 = puVar24;
            if (iVar13 <= (int)uVar23) goto LAB_008b9c1d;
          }
          else {
            puVar11 = puVar1;
            if (iVar25 < (int)uVar23) goto LAB_008b9c1d;
          }
          pVVar9 = Mio_SopCoverOr(*(Vec_Int_t **)(*(long *)puVar10 + (ulong)uVar18 * 8),
                                  *(Vec_Int_t **)(*(long *)puVar11 + (ulong)uVar23 * 8));
          iVar14 = (int)uVar16;
          if (iVar13 == iVar14) {
            if (iVar14 < 0x10) {
              if (*(void **)puVar24 == (void *)0x0) {
                pvVar7 = malloc(0x80);
              }
              else {
                pvVar7 = realloc(*(void **)puVar24,0x80);
              }
              *(void **)(__ptr + 2) = pvVar7;
              *__ptr = 0x10;
              uVar16 = 0x10;
            }
            else {
              uVar16 = (ulong)(uint)(iVar14 * 2);
              if (*(void **)puVar24 == (void *)0x0) {
                pvVar7 = malloc(uVar16 * 8);
              }
              else {
                pvVar7 = realloc(*(void **)puVar24,uVar16 * 8);
              }
              *(void **)(__ptr + 2) = pvVar7;
              *__ptr = iVar14 * 2;
            }
          }
          else {
            pvVar7 = *(void **)puVar24;
          }
          __ptr[1] = uVar12 + iVar17 + 1;
          *(Vec_Int_t **)((long)pvVar7 + lVar22 * 8 + (ulong)uVar12 * 8) = pVVar9;
          lVar22 = lVar22 + 1;
          uVar15 = vExpr->nSize;
          lVar19 = lVar19 + 2;
        } while (lVar22 < (int)uVar15 / 2);
      }
      else {
        uVar21 = 0;
        do {
          iVar14 = (int)uVar21;
          pVVar9 = Mio_SopVar0(iVar14);
          iVar17 = (int)uVar16;
          if (iVar14 == iVar17) {
            if (iVar17 < 0x10) {
              if (*(void **)puVar24 == (void *)0x0) {
                pvVar7 = malloc(0x80);
              }
              else {
                pvVar7 = realloc(*(void **)puVar24,0x80);
              }
              *(void **)(__ptr + 2) = pvVar7;
              *__ptr = 0x10;
              uVar16 = 0x10;
            }
            else {
              uVar16 = (ulong)(uint)(iVar17 * 2);
              if (*(void **)puVar24 == (void *)0x0) {
                pvVar7 = malloc(uVar16 * 8);
              }
              else {
                pvVar7 = realloc(*(void **)puVar24,uVar16 * 8);
              }
              *(void **)(__ptr + 2) = pvVar7;
              *__ptr = iVar17 * 2;
            }
          }
          else {
            pvVar7 = *(void **)puVar24;
          }
          __ptr[1] = iVar14 + 1;
          *(Vec_Int_t **)((long)pvVar7 + uVar21 * 8) = pVVar9;
          pVVar9 = Mio_SopVar1(iVar14);
          iVar17 = (int)local_c0;
          if (iVar14 == iVar17) {
            if (iVar17 < 0x10) {
              if (*(void **)puVar1 == (void *)0x0) {
                pvVar7 = malloc(0x80);
              }
              else {
                pvVar7 = realloc(*(void **)puVar1,0x80);
              }
              *(void **)(puVar8 + 2) = pvVar7;
              *puVar8 = 0x10;
              local_c0 = 0x10;
            }
            else {
              local_c0 = (ulong)(uint)(iVar17 * 2);
              if (*(void **)puVar1 == (void *)0x0) {
                pvVar7 = malloc(local_c0 * 8);
              }
              else {
                pvVar7 = realloc(*(void **)puVar1,local_c0 * 8);
              }
              *(void **)(puVar8 + 2) = pvVar7;
              *puVar8 = iVar17 * 2;
            }
          }
          else {
            pvVar7 = *(void **)puVar1;
          }
          uVar20 = uVar21 + 1;
          uVar12 = (uint)uVar20;
          puVar8[1] = uVar12;
          *(Vec_Int_t **)((long)pvVar7 + uVar21 * 8) = pVVar9;
          uVar21 = uVar20;
        } while (nVars != uVar12);
        uVar15 = vExpr->nSize;
        if (1 < (int)uVar15) goto LAB_008b9756;
      }
      if ((int)uVar15 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
      }
      puVar24 = puVar8;
      if ((*(byte *)(vExpr->pArray + ((ulong)uVar15 - 1)) & 1) == 0) {
        puVar24 = __ptr;
        __ptr = puVar8;
      }
      if (((long)(int)puVar24[1] < 1) || ((long)(int)__ptr[1] < 1)) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
      }
      pVVar9 = *(Vec_Int_t **)(*(long *)(puVar24 + 2) + -8 + (long)(int)puVar24[1] * 8);
      pVVar4 = *(Vec_Int_t **)(*(long *)(__ptr + 2) + -8 + (long)(int)__ptr[1] * 8);
      if (pVVar4->nSize <= pVVar9->nSize) {
        pVVar9 = pVVar4;
      }
      Mio_SopDeriveFromArray(pVVar9,nVars,vStr,(uint)(pVVar9 == pVVar4));
      uVar15 = puVar24[1];
      if (0 < (int)uVar15) {
        lVar19 = 0;
        do {
          pvVar7 = *(void **)(*(long *)(puVar24 + 2) + lVar19 * 8);
          if (pvVar7 != (void *)0x0) {
            if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar7 + 8));
            }
            free(pvVar7);
            uVar15 = puVar24[1];
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < (int)uVar15);
      }
      if (*(void **)(puVar24 + 2) != (void *)0x0) {
        free(*(void **)(puVar24 + 2));
      }
      free(puVar24);
      uVar15 = __ptr[1];
      if (0 < (int)uVar15) {
        lVar19 = 0;
        do {
          pvVar7 = *(void **)(*(long *)(__ptr + 2) + lVar19 * 8);
          if (pvVar7 != (void *)0x0) {
            if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar7 + 8));
            }
            free(pvVar7);
            uVar15 = __ptr[1];
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < (int)uVar15);
      }
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
      }
      free(__ptr);
      goto LAB_008b9552;
    }
    ppcVar26 = &vStr->pArray;
    lVar19 = 0;
    do {
      cVar2 = " 0 0\n"[lVar19 + 2];
      uVar15 = vStr->nSize;
      if (uVar15 == vStr->nCap) {
        if ((int)uVar15 < 0x10) {
          if (*ppcVar26 == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(*ppcVar26,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar5 = (ulong)uVar15 * 2;
          if (*ppcVar26 == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar5);
          }
          else {
            pcVar6 = (char *)realloc(*ppcVar26,sVar5);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar5;
        }
      }
      else {
        pcVar6 = *ppcVar26;
      }
      iVar17 = vStr->nSize;
      vStr->nSize = iVar17 + 1;
      pcVar6[iVar17] = cVar2;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
  }
  ppcVar26 = &vStr->pArray;
  uVar15 = vStr->nSize;
  if (uVar15 == vStr->nCap) {
    if ((int)uVar15 < 0x10) {
      if (*ppcVar26 == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(*ppcVar26,0x10);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = 0x10;
    }
    else {
      sVar5 = (ulong)uVar15 * 2;
      if (*ppcVar26 == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar5);
      }
      else {
        pcVar6 = (char *)realloc(*ppcVar26,sVar5);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = (int)sVar5;
    }
  }
  else {
    pcVar6 = *ppcVar26;
  }
  iVar17 = vStr->nSize;
  vStr->nSize = iVar17 + 1;
  pcVar6[iVar17] = '\0';
LAB_008b9552:
  return vStr->pArray;
}

Assistant:

char * Mio_LibDeriveSop( int nVars, Vec_Int_t * vExpr, Vec_Str_t * vStr )
{
    Vec_Int_t * vSop;
    Vec_Ptr_t * vSops0, * vSops1, * vTemp;
    int i, Index0, Index1, fCompl0, fCompl1;
    Vec_StrClear( vStr );
    if ( Exp_IsConst0(vExpr) )
    {
        Vec_StrPrintStr( vStr, " 0\n" );
        Vec_StrPush( vStr, '\0' );
        return Vec_StrArray( vStr );
    }
    if ( Exp_IsConst1(vExpr) )
    {
        Vec_StrPrintStr( vStr, " 1\n" );
        Vec_StrPush( vStr, '\0' );
        return Vec_StrArray( vStr );
    }
    if ( Exp_IsLit(vExpr) )
    {
        for ( i = 0; i < nVars; i++ )
            Vec_StrPush( vStr, '-' );
        Vec_StrPrintStr( vStr, " 1\n" );
        Vec_StrPush( vStr, '\0' );
        assert( (Vec_IntEntry(vExpr,0) >> 1) < nVars );
        Vec_StrWriteEntry( vStr, Vec_IntEntry(vExpr,0) >> 1, (char)('1' - (Vec_IntEntry(vExpr,0) & 1)) );
        return Vec_StrArray( vStr );
    }
    vSops0 = Vec_PtrAlloc( nVars + Exp_NodeNum(vExpr) );
    vSops1 = Vec_PtrAlloc( nVars + Exp_NodeNum(vExpr) );
    for ( i = 0; i < nVars; i++ )
    {
        Vec_PtrPush( vSops0, Mio_SopVar0(i) );
        Vec_PtrPush( vSops1, Mio_SopVar1(i) );
    }
    for ( i = 0; i < Exp_NodeNum(vExpr); i++ )
    {
        Index0  = Vec_IntEntry( vExpr, 2*i+0 ) >> 1;
        Index1  = Vec_IntEntry( vExpr, 2*i+1 ) >> 1;
        fCompl0 = Vec_IntEntry( vExpr, 2*i+0 ) & 1;
        fCompl1 = Vec_IntEntry( vExpr, 2*i+1 ) & 1;
        // positive polarity
        vSop = Mio_SopCoverAnd( fCompl0 ? (Vec_Int_t *)Vec_PtrEntry(vSops0, Index0) : (Vec_Int_t *)Vec_PtrEntry(vSops1, Index0),
                                fCompl1 ? (Vec_Int_t *)Vec_PtrEntry(vSops0, Index1) : (Vec_Int_t *)Vec_PtrEntry(vSops1, Index1) );
        Vec_PtrPush( vSops1, vSop );
        // negative polarity
        vSop = Mio_SopCoverOr( fCompl0 ? (Vec_Int_t *)Vec_PtrEntry(vSops1, Index0) : (Vec_Int_t *)Vec_PtrEntry(vSops0, Index0),
                               fCompl1 ? (Vec_Int_t *)Vec_PtrEntry(vSops1, Index1) : (Vec_Int_t *)Vec_PtrEntry(vSops0, Index1) );
        Vec_PtrPush( vSops0, vSop );
    }
    // complement
    if ( Vec_IntEntryLast(vExpr) & 1 )
    {
        vTemp  = vSops0;
        vSops0 = vSops1;
        vSops1 = vTemp;
    }
    // select the best polarity
    if ( Vec_IntSize( (Vec_Int_t *)Vec_PtrEntryLast(vSops0) ) < Vec_IntSize( (Vec_Int_t *)Vec_PtrEntryLast(vSops1) ) )
        vSop = (Vec_Int_t *)Vec_PtrEntryLast(vSops0);
    else
        vSop = (Vec_Int_t *)Vec_PtrEntryLast(vSops1);
    // convert positive polarity into SOP
    Mio_SopDeriveFromArray( vSop, nVars, vStr, (vSop == Vec_PtrEntryLast(vSops1)) );
    Vec_VecFree( (Vec_Vec_t *)vSops0 );
    Vec_VecFree( (Vec_Vec_t *)vSops1 );
    return Vec_StrArray( vStr );
}